

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

void pnga_sprs_array_col_block_list(Integer s_a,Integer **idx,Integer *n)

{
  Integer *pIVar1;
  _sparse_array *p_Var2;
  Integer *pIVar3;
  long lVar4;
  
  lVar4 = SPA[s_a + 1000].nblocks;
  *n = lVar4;
  pIVar3 = (Integer *)malloc(lVar4 << 3);
  *idx = pIVar3;
  p_Var2 = SPA;
  if (0 < SPA[s_a + 1000].nblocks) {
    pIVar1 = SPA[s_a + 1000].blkidx;
    lVar4 = 0;
    do {
      pIVar3[lVar4] = pIVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 < p_Var2[s_a + 1000].nblocks);
  }
  return;
}

Assistant:

void pnga_sprs_array_col_block_list(Integer s_a, Integer **idx, Integer *n)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer i, index;
  *n = SPA[hdl].nblocks;
  *idx = (Integer*)malloc(SPA[hdl].nblocks*sizeof(Integer));
  for (i=0; i<SPA[hdl].nblocks; i++) {
    (*idx)[i] = SPA[hdl].blkidx[i];
  }
}